

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::DecodeTiledPixelData
               (uchar **out_images,int *width,int *height,int *requested_pixel_types,uchar *data_ptr
               ,size_t data_len,int compression_type,int line_order,int data_width,int data_height,
               int tile_offset_x,int tile_offset_y,int tile_size_x,int tile_size_y,
               size_t pixel_data_size,size_t num_attributes,EXRAttribute *attributes,
               size_t num_channels,EXRChannelInfo *channels,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list)

{
  size_t data_len_local;
  uchar *data_ptr_local;
  int *requested_pixel_types_local;
  int *height_local;
  int *width_local;
  uchar **out_images_local;
  
  if ((data_width < tile_size_x * tile_offset_x) || (data_height < tile_size_y * tile_offset_y)) {
    out_images_local._7_1_ = false;
  }
  else {
    if ((tile_offset_x + 1) * tile_size_x < data_width) {
      *width = tile_size_x;
    }
    else {
      *width = data_width - tile_offset_x * tile_size_x;
    }
    if ((tile_offset_y + 1) * tile_size_y < data_height) {
      *height = tile_size_y;
    }
    else {
      *height = data_height - tile_offset_y * tile_size_y;
    }
    out_images_local._7_1_ =
         DecodePixelData(out_images,requested_pixel_types,data_ptr,data_len,compression_type,
                         line_order,*width,tile_size_y,tile_size_x,0,0,*height,pixel_data_size,
                         num_attributes,attributes,num_channels,channels,channel_offset_list);
  }
  return out_images_local._7_1_;
}

Assistant:

static bool DecodeTiledPixelData(
    unsigned char **out_images, int *width, int *height,
    const int *requested_pixel_types, const unsigned char *data_ptr,
    size_t data_len, int compression_type, int line_order, int data_width,
    int data_height, int tile_offset_x, int tile_offset_y, int tile_size_x,
    int tile_size_y, size_t pixel_data_size, size_t num_attributes,
    const EXRAttribute *attributes, size_t num_channels,
    const EXRChannelInfo *channels,
    const std::vector<size_t> &channel_offset_list) {
  // Here, data_width and data_height are the dimensions of the current (sub)level.
  if (tile_size_x * tile_offset_x > data_width ||
      tile_size_y * tile_offset_y > data_height) {
    return false;
  }

  // Compute actual image size in a tile.
  if ((tile_offset_x + 1) * tile_size_x >= data_width) {
    (*width) = data_width - (tile_offset_x * tile_size_x);
  } else {
    (*width) = tile_size_x;
  }

  if ((tile_offset_y + 1) * tile_size_y >= data_height) {
    (*height) = data_height - (tile_offset_y * tile_size_y);
  } else {
    (*height) = tile_size_y;
  }

  // Image size = tile size.
  return DecodePixelData(out_images, requested_pixel_types, data_ptr, data_len,
                         compression_type, line_order, (*width), tile_size_y,
                         /* stride */ tile_size_x, /* y */ 0, /* line_no */ 0,
                         (*height), pixel_data_size, num_attributes, attributes,
                         num_channels, channels, channel_offset_list);
}